

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

int __thiscall
array<vector3_base<int>,_allocator_default<vector3_base<int>_>_>::insert
          (array<vector3_base<int>,_allocator_default<vector3_base<int>_>_> *this,
          vector3_base<int> *item,range r)

{
  long lVar1;
  vector3_base<int> *pvVar2;
  anon_union_4_3_4e90b0cd_for_vector3_base<int>_3 aVar3;
  int iVar4;
  vector3_base<int> *pvVar5;
  long lVar6;
  long lVar7;
  long in_FS_OFFSET;
  range r_local;
  
  r_local.end = r.end;
  r_local.begin = r.begin;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (r_local.begin < r_local.end) {
    pvVar5 = plain_range<vector3_base<int>_>::front(&r_local);
    pvVar2 = this->list;
    incsize(this);
    set_size(this,this->num_elements + 1);
    lVar6 = (long)this->num_elements;
    iVar4 = (int)(((long)pvVar5 - (long)pvVar2) / 0xc);
    lVar7 = lVar6 * 0xc;
    while( true ) {
      lVar6 = lVar6 + -1;
      pvVar2 = this->list;
      if (lVar6 <= iVar4) break;
      *(undefined4 *)((long)&pvVar2[-1].field_2 + lVar7) =
           *(undefined4 *)((long)&pvVar2[-2].field_2 + lVar7);
      *(undefined8 *)((long)&pvVar2[-1].field_0 + lVar7) =
           *(undefined8 *)((long)&pvVar2[-2].field_0 + lVar7);
      lVar7 = lVar7 + -0xc;
    }
    pvVar2[iVar4].field_2 = item->field_2;
    aVar3 = item->field_1;
    pvVar2[iVar4].field_0 = item->field_0;
    pvVar2[iVar4].field_1 = aVar3;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return this->num_elements + -1;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    iVar4 = add(this,item);
    return iVar4;
  }
  __stack_chk_fail();
}

Assistant:

int insert(const T& item, range r)
	{
		if(r.empty())
			return add(item);

		int index = (int)(&r.front()-list);
		incsize();
		set_size(size()+1);

		for(int i = num_elements-1; i > index; i--)
			list[i] = list[i-1];

		list[index] = item;

		return num_elements-1;
	}